

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlDocPtr htmlReadFd(int fd,char *URL,char *encoding,int options)

{
  xmlParserInputBufferPtr in;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  htmlDocPtr pxVar1;
  
  if (-1 < fd) {
    xmlInitParser();
    xmlInitParser();
    in = xmlParserInputBufferCreateFd(fd,XML_CHAR_ENCODING_NONE);
    if (in != (xmlParserInputBufferPtr)0x0) {
      ctxt = xmlNewParserCtxt();
      if (ctxt == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(in);
      }
      else {
        value = xmlNewIOInputStream(ctxt,in,XML_CHAR_ENCODING_NONE);
        if (value != (xmlParserInputPtr)0x0) {
          inputPush(ctxt,value);
          pxVar1 = htmlDoRead(ctxt,URL,encoding,options,0);
          return pxVar1;
        }
        xmlFreeParserInputBuffer(in);
        xmlFreeParserCtxt(ctxt);
      }
    }
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlReadFd(int fd, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (fd < 0)
        return (NULL);
    xmlInitParser();

    xmlInitParser();
    input = xmlParserInputBufferCreateFd(fd, XML_CHAR_ENCODING_NONE);
    if (input == NULL)
        return (NULL);
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}